

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttpost.c
# Opt level: O2

FT_Error load_post_names(TT_Face face)

{
  byte bVar1;
  ushort uVar2;
  FT_Stream stream;
  FT_UInt16 FVar3;
  FT_Int n;
  FT_Error FVar4;
  FT_UShort *pFVar5;
  FT_Char **P;
  long lVar6;
  long lVar7;
  uint uVar8;
  FT_Memory memory;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  FT_Byte *pFVar12;
  ulong new_count;
  ulong uStack_70;
  FT_Error local_64;
  FT_Byte *local_60;
  FT_Memory local_58;
  FT_UShort *local_50;
  FT_UInt16 local_42;
  FT_Char **local_40;
  FT_ULong post_len;
  
  stream = (face->root).stream;
  FVar4 = (*face->goto_table)(face,0x706f7374,stream,&post_len);
  if (FVar4 != 0) {
    return FVar4;
  }
  lVar6 = (face->postscript).FormatType;
  FVar4 = FT_Stream_Skip(stream,0x20);
  if (FVar4 != 0) {
    return FVar4;
  }
  if (post_len < 0x22 || lVar6 != 0x20000) {
    if (lVar6 != 0x25000 || post_len < 0x22) {
      FVar4 = 3;
      goto LAB_0020b8b1;
    }
    memory = stream->memory;
    FVar3 = FT_Stream_ReadUShort(stream,&local_64);
    FVar4 = local_64;
    if (((local_64 != 0) || (FVar4 = 3, 0x102 < FVar3)) ||
       ((face->max_profile).numGlyphs <= (ushort)(FVar3 - 1))) goto LAB_0020b8b1;
    uVar9 = (ulong)FVar3;
    pFVar5 = (FT_UShort *)ft_mem_qrealloc(memory,1,0,uVar9,(void *)0x0,&local_64);
    if ((local_64 == 0) &&
       (local_64 = FT_Stream_Read(stream,(FT_Byte *)pFVar5,uVar9), local_64 == 0)) {
      lVar6 = -1;
      do {
        if (lVar6 - uVar9 == -1) {
          (face->postscript_names).names.format_20.num_glyphs = FVar3;
          (face->postscript_names).names.format_25.offsets = (FT_Char *)pFVar5;
          FVar4 = 0;
          goto LAB_0020b8b1;
        }
        lVar7 = (char)*(FT_Byte *)((long)pFVar5 + lVar6 + 1) + lVar6;
        lVar6 = lVar6 + 1;
      } while (lVar7 + 1U <= uVar9);
      local_64 = 3;
    }
  }
  else {
    memory = stream->memory;
    local_42 = FT_Stream_ReadUShort(stream,&local_64);
    FVar4 = local_64;
    if ((local_64 != 0) || (FVar4 = 3, (face->max_profile).numGlyphs < local_42)) goto LAB_0020b8b1;
    local_60 = (FT_Byte *)(ulong)local_42;
    uVar9 = (ulong)((uint)local_42 + (uint)local_42);
    uStack_70 = (post_len - 0x22) - uVar9;
    if (post_len - 0x22 < uVar9) goto LAB_0020b8b1;
    pFVar5 = (FT_UShort *)ft_mem_qrealloc(memory,2,0,(FT_Long)local_60,(void *)0x0,&local_64);
    pFVar12 = (FT_Byte *)0x0;
    P = (FT_Char **)0x0;
    if (local_64 == 0) {
      local_50 = pFVar5;
      local_64 = FT_Stream_EnterFrame(stream,uVar9);
      pFVar5 = local_50;
      if (local_64 == 0) {
        for (pFVar12 = (FT_Byte *)0x0; local_60 != pFVar12; pFVar12 = pFVar12 + 1) {
          FVar3 = FT_Stream_GetUShort(stream);
          pFVar5[(long)pFVar12] = FVar3;
        }
        local_58 = memory;
        FT_Stream_ExitFrame(stream);
        pFVar12 = (FT_Byte *)0x0;
        uVar9 = 0;
        while( true ) {
          new_count = uVar9 & 0xffff;
          if (local_60 == pFVar12) break;
          uVar2 = pFVar5[(long)pFVar12];
          uVar8 = uVar2 - 0x101;
          uVar9 = (ulong)uVar8;
          if ((int)uVar8 <= (int)new_count) {
            uVar9 = new_count;
          }
          if (uVar2 < 0x102) {
            uVar9 = new_count;
          }
          pFVar12 = pFVar12 + 1;
        }
        if ((FT_UShort)uVar9 == 0) {
          P = (FT_Char **)0x0;
LAB_0020b96b:
          (face->postscript_names).names.format_20.num_glyphs = local_42;
          (face->postscript_names).names.format_20.num_names = (FT_UShort)uVar9;
          (face->postscript_names).names.format_20.glyph_indices = local_50;
          (face->postscript_names).names.format_20.glyph_names = P;
          FVar4 = 0;
          goto LAB_0020b8b1;
        }
        pFVar12 = (FT_Byte *)ft_mem_qalloc(local_58,uStack_70 + 1,&local_64);
        if (local_64 == 0) {
          local_60 = pFVar12;
          local_64 = FT_Stream_Read(stream,pFVar12,uStack_70);
          if (local_64 == 0) {
            P = (FT_Char **)ft_mem_qrealloc(local_58,8,0,new_count,(void *)0x0,&local_64);
            pFVar12 = local_60;
            memory = local_58;
            pFVar5 = local_50;
            if (local_64 == 0) {
              uVar10 = 0;
              for (uVar11 = 0; (uVar10 < uStack_70 && (uVar11 < new_count)); uVar11 = uVar11 + 1) {
                bVar1 = local_60[uVar10];
                if (0x3f < (ulong)bVar1) {
                  local_64 = 3;
                  goto LAB_0020b7a9;
                }
                local_60[uVar10] = '\0';
                P[uVar11] = (FT_Char *)(local_60 + uVar10 + 1);
                uVar10 = uVar10 + bVar1 + 1;
              }
              local_60[uStack_70] = '\0';
              if (new_count <= uVar11) goto LAB_0020b96b;
              local_40 = P;
              if (uStack_70 == 0) {
                uStack_70 = 1;
                local_60 = (FT_Byte *)ft_mem_qrealloc(local_58,1,1,2,local_60,&local_64);
                pFVar12 = local_60;
                memory = local_58;
                P = local_40;
                pFVar5 = local_50;
                if (local_64 != 0) goto LAB_0020b7a9;
                local_60[1] = '\0';
              }
              if (new_count < uVar11) {
                new_count = uVar11;
              }
              for (; P = local_40, new_count != uVar11; uVar11 = uVar11 + 1) {
                local_40[uVar11] = (FT_Char *)(local_60 + uStack_70);
              }
              goto LAB_0020b96b;
            }
          }
          else {
            P = (FT_Char **)0x0;
            pFVar12 = local_60;
            memory = local_58;
            pFVar5 = local_50;
          }
        }
        else {
          P = (FT_Char **)0x0;
          memory = local_58;
          pFVar5 = local_50;
        }
      }
      else {
        P = (FT_Char **)0x0;
        pFVar12 = (FT_Byte *)0x0;
      }
    }
LAB_0020b7a9:
    ft_mem_free(memory,P);
    ft_mem_free(memory,pFVar12);
  }
  ft_mem_free(memory,pFVar5);
  FVar4 = local_64;
LAB_0020b8b1:
  (face->postscript_names).loaded = '\x01';
  return FVar4;
}

Assistant:

static FT_Error
  load_post_names( TT_Face  face )
  {
    FT_Stream  stream;
    FT_Error   error;
    FT_Fixed   format;
    FT_ULong   post_len;


    /* get a stream for the face's resource */
    stream = face->root.stream;

    /* seek to the beginning of the PS names table */
    error = face->goto_table( face, TTAG_post, stream, &post_len );
    if ( error )
      goto Exit;

    format = face->postscript.FormatType;

    /* go to beginning of subtable */
    if ( FT_STREAM_SKIP( 32 ) )
      goto Exit;

    /* now read postscript table */
    if ( format == 0x00020000L && post_len >= 34 )
      error = load_format_20( face, stream, post_len - 32 );
    else if ( format == 0x00025000L && post_len >= 34 )
      error = load_format_25( face, stream, post_len - 32 );
    else
      error = FT_THROW( Invalid_File_Format );

    face->postscript_names.loaded = 1;

  Exit:
    return error;
  }